

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationTests.cpp
# Opt level: O0

void vkt::synchronization::anon_unknown_1::createChildren(TestCaseGroup *group)

{
  TestContext *pTVar1;
  TestContext *this;
  TestNode *pTVar2;
  OperationTests *this_00;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  TestContext *local_18;
  TestContext *testCtx;
  TestCaseGroup *group_local;
  
  testCtx = (TestContext *)group;
  local_18 = tcu::TestNode::getTestContext(&group->super_TestNode);
  pTVar1 = testCtx;
  pTVar2 = &createSmokeTests(local_18)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  this = testCtx;
  pTVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"basic",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Basic synchronization tests",&local_71);
  pTVar2 = &createTestGroup(pTVar1,&local_38,&local_70,createBasicTests)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pTVar1 = testCtx;
  this_00 = (OperationTests *)operator_new(0x90);
  OperationTests::OperationTests(this_00,local_18);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)this_00);
  pTVar1 = testCtx;
  pTVar2 = &createInternallySynchronizedObjects(local_18)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  return;
}

Assistant:

void createChildren (tcu::TestCaseGroup* group)
{
	tcu::TestContext& testCtx = group->getTestContext();

	group->addChild(createSmokeTests(testCtx));
	group->addChild(createTestGroup	(testCtx, "basic", "Basic synchronization tests", createBasicTests));
	group->addChild(new OperationTests(testCtx));
	group->addChild(createInternallySynchronizedObjects(testCtx));
}